

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O2

FT_ULong cff_index_read_offset(CFF_Index idx,FT_Error *errorp)

{
  FT_Error FVar1;
  FT_ULong FVar2;
  ulong uVar3;
  FT_Byte tmp [4];
  byte local_14 [4];
  
  FVar1 = FT_Stream_Read(idx->stream,local_14,(ulong)idx->off_size);
  if (FVar1 == 0) {
    FVar2 = 0;
    for (uVar3 = 0; idx->off_size != uVar3; uVar3 = uVar3 + 1) {
      FVar2 = FVar2 << 8 | (ulong)local_14[uVar3];
    }
  }
  else {
    FVar2 = 0;
  }
  *errorp = FVar1;
  return FVar2;
}

Assistant:

static FT_ULong
  cff_index_read_offset( CFF_Index  idx,
                         FT_Error  *errorp )
  {
    FT_Error   error;
    FT_Stream  stream = idx->stream;
    FT_Byte    tmp[4];
    FT_ULong   result = 0;


    if ( !FT_STREAM_READ( tmp, idx->off_size ) )
    {
      FT_Int  nn;


      for ( nn = 0; nn < idx->off_size; nn++ )
        result = ( result << 8 ) | tmp[nn];
    }

    *errorp = error;
    return result;
  }